

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O2

ssize_t __thiscall zmq::pipe_t::read(pipe_t *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int __fd_00;
  undefined4 in_register_00000034;
  msg_t *this_00;
  msg_t *pmVar4;
  
  this_00 = (msg_t *)CONCAT44(in_register_00000034,__fd);
  if ((this->_in_active == true) && ((this->_state & ~waiting_for_delimiter) == active)) {
    while( true ) {
      pmVar4 = this_00;
      iVar3 = (*this->_in_pipe->_vptr_ypipe_base_t[6])();
      __fd_00 = (int)pmVar4;
      if ((char)iVar3 == '\0') break;
      bVar1 = msg_t::is_credential(this_00);
      if (!bVar1) {
        bVar1 = msg_t::is_delimiter(this_00);
        if (bVar1) {
          process_delimiter(this);
          return 0;
        }
        bVar2 = msg_t::flags(this_00);
        if (((bVar2 & 1) == 0) && (bVar1 = msg_t::is_routing_id(this_00), !bVar1)) {
          this->_msgs_read = this->_msgs_read + 1;
        }
        if (0 < (long)this->_lwm) {
          if (this->_msgs_read % (ulong)(long)this->_lwm == 0) {
            object_t::send_activate_write(&this->super_object_t,this->_peer,this->_msgs_read);
            return 0x24d701;
          }
          return 0x24d701;
        }
        return 0x24d701;
      }
      iVar3 = msg_t::close(this_00,__fd_00);
      if (iVar3 != 0) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/pipe.cpp"
                ,0xd5);
        fflush(_stderr);
        zmq_abort("rc == 0");
      }
    }
    this->_in_active = false;
  }
  return 0;
}

Assistant:

bool zmq::pipe_t::read (msg_t *msg_)
{
    if (unlikely (!_in_active))
        return false;
    if (unlikely (_state != active && _state != waiting_for_delimiter))
        return false;

    while (true) {
        if (!_in_pipe->read (msg_)) {
            _in_active = false;
            return false;
        }

        //  If this is a credential, ignore it and receive next message.
        if (unlikely (msg_->is_credential ())) {
            const int rc = msg_->close ();
            zmq_assert (rc == 0);
        } else {
            break;
        }
    }

    //  If delimiter was read, start termination process of the pipe.
    if (msg_->is_delimiter ()) {
        process_delimiter ();
        return false;
    }

    if (!(msg_->flags () & msg_t::more) && !msg_->is_routing_id ())
        _msgs_read++;

    if (_lwm > 0 && _msgs_read % _lwm == 0)
        send_activate_write (_peer, _msgs_read);

    return true;
}